

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::ShaderAtomicExchangeCase::getInputs
          (ShaderAtomicExchangeCase *this,int numValues,int stride,void *inputs)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar3 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1];
  uVar1 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2];
  uVar4 = iVar3 * uVar1;
  if (0 < numValues / (int)uVar4) {
    iVar5 = 0;
    iVar6 = 0;
    do {
      if (0 < (int)uVar4) {
        uVar2 = 0;
        iVar7 = iVar5;
        do {
          uVar2 = uVar2 + 1;
          *(int *)((long)inputs + (long)iVar7) = (int)uVar2;
          iVar7 = iVar7 + stride;
        } while (uVar4 != uVar2);
      }
      iVar6 = iVar6 + 1;
      iVar5 = iVar5 + iVar3 * uVar1 * stride;
    } while (iVar6 != numValues / (int)uVar4);
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		const int	workGroupSize	= (int)product(m_workGroupSize);
		const int	numWorkGroups	= numValues/workGroupSize;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int groupOffset = groupNdx*workGroupSize;

			for (int localNdx = 0; localNdx < workGroupSize; localNdx++)
				*(int*)((deUint8*)inputs + stride*(groupOffset+localNdx)) = localNdx+1;
		}
	}